

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall
Apple::IIgs::Sound::GLU::GLU(GLU *this,AsyncTaskQueue<false,_true,_void> *audio_queue)

{
  MemoryWrite __i;
  int local_24;
  uint7 uStack_20;
  int c;
  MemoryWrite disabled_write;
  AsyncTaskQueue<false,_true,_void> *audio_queue_local;
  GLU *this_local;
  
  this->audio_queue_ = audio_queue;
  this->address_ = 0;
  this->pending_store_read_ = 0;
  this->pending_store_read_time_ = 0;
  this->pending_store_write_ = 0;
  this->pending_store_write_time_ = 0;
  EnsoniqState::EnsoniqState(&this->local_);
  EnsoniqState::EnsoniqState(&this->remote_);
  this->output_range_ = 0;
  for (local_24 = 0; local_24 < 0x4000; local_24 = local_24 + 1) {
    __i.enabled = false;
    __i._0_7_ = uStack_20;
    std::atomic<Apple::IIgs::Sound::GLU::MemoryWrite>::store
              (this->pending_stores_ + local_24,__i,memory_order_seq_cst);
  }
  return;
}

Assistant:

GLU::GLU(Concurrency::AsyncTaskQueue<false> &audio_queue) : audio_queue_(audio_queue) {
	// Reset all pending stores.
	MemoryWrite disabled_write;
	disabled_write.enabled = false;
	for(int c = 0; c < StoreBufferSize; c++) {
		pending_stores_[c].store(disabled_write);
	}
}